

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_event clCreateUserEvent(cl_context context,cl_int *errcode_ret)

{
  CTracker *pCVar1;
  ulong enqueueCounter;
  CLIntercept *this;
  byte bVar2;
  time_point start;
  cl_event p_Var3;
  time_point end;
  allocator local_55;
  cl_int localErrorCode;
  string local_50;
  
  this = g_pIntercept;
  if ((g_pIntercept == (CLIntercept *)0x0) ||
     ((g_pIntercept->m_Dispatch).clCreateUserEvent == (cl_api_clCreateUserEvent)0x0)) {
    if (errcode_ret != (cl_int *)0x0) {
      *errcode_ret = -0x22;
    }
    return (cl_event)0x0;
  }
  enqueueCounter = (g_pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  bVar2 = (g_pIntercept->m_Config).CallLogging;
  if ((bool)bVar2 == true) {
    CLIntercept::callLoggingEnter
              (g_pIntercept,"clCreateUserEvent",enqueueCounter,(cl_kernel)0x0,"context = %p",context
              );
    bVar2 = (this->m_Config).CallLogging;
  }
  localErrorCode = 0;
  if ((((bVar2 & 1) == 0) && ((this->m_Config).ErrorLogging == false)) &&
     ((this->m_Config).ErrorAssert == false)) {
    if ((errcode_ret == (cl_int *)0x0) && ((this->m_Config).NoErrors != false)) {
LAB_00113cd4:
      errcode_ret = &localErrorCode;
    }
  }
  else if (errcode_ret == (cl_int *)0x0) goto LAB_00113cd4;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    start.__d.__r = (duration)0;
  }
  else {
    start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  p_Var3 = (*(this->m_Dispatch).clCreateUserEvent)(context,errcode_ret);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_50,"",&local_55);
      CLIntercept::updateHostTimingStats(this,"clCreateUserEvent",&local_50,start,end);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar2 = (this->m_Config).ErrorAssert;
    if ((((bool)bVar2 == false) && ((this->m_Config).NoErrors != true)) || (*errcode_ret == 0))
    goto LAB_00113dec;
  }
  else {
    if (*errcode_ret == 0) goto LAB_00113dec;
    CLIntercept::logError(this,"clCreateUserEvent",*errcode_ret);
    bVar2 = (this->m_Config).ErrorAssert;
  }
  if ((bVar2 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors == true) {
    *errcode_ret = 0;
  }
LAB_00113dec:
  if ((p_Var3 != (cl_event)0x0) && ((this->m_Config).LeakChecking != false)) {
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_Events;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clCreateUserEvent",*errcode_ret,(cl_event *)0x0,(cl_sync_point_khr *)0x0,
               "returned %p",p_Var3);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_50,"",&local_55);
    CLIntercept::chromeCallLoggingExit(this,"clCreateUserEvent",&local_50,false,0,start,end);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return p_Var3;
}

Assistant:

CL_API_ENTRY cl_event CL_API_CALL CLIRN(clCreateUserEvent)(
    cl_context context,
    cl_int *errcode_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clCreateUserEvent )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER( "context = %p",
            context );
        CHECK_ERROR_INIT( errcode_ret );
        HOST_PERFORMANCE_TIMING_START();

        cl_event    retVal = pIntercept->dispatch().clCreateUserEvent(
            context,
            errcode_ret );

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( errcode_ret[0] );
        ADD_OBJECT_ALLOCATION( retVal );
        CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

        return retVal;
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}